

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pbVar2 = this->pos;
  if (this->start < pbVar2) {
    do {
      this->pos = pbVar2 + -1;
      pcVar1 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2[-1].field_2) {
        operator_delete(pcVar1,pbVar2[-1].field_2._M_allocated_capacity + 1);
      }
      pbVar2 = this->pos;
    } while (this->start < pbVar2);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }